

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lexUntilQuote(Lexer *this,SyntaxToken *tk,uchar quote,uint accLeng)

{
  uchar uVar1;
  int iVar2;
  CharacterConstant *pCVar3;
  uint size;
  char *s;
  
  s = this->yytext_ + ~(ulong)accLeng;
  while (uVar1 = this->yychar_, uVar1 != quote) {
    if (uVar1 == '\\') {
      lexBackslash(this,tk->syntaxK_);
    }
    else {
      if ((uVar1 == '\0') || (uVar1 == '\n')) break;
      yyinput(this);
    }
  }
  iVar2 = *(int *)&this->yytext_;
  if (uVar1 == quote) {
    yyinput(this);
  }
  size = accLeng + (iVar2 - (int)s) + 1;
  if (quote == '\'') {
    pCVar3 = SyntaxTree::findOrInsertCharacterConstant(this->tree_,s,size);
  }
  else {
    pCVar3 = (CharacterConstant *)SyntaxTree::findOrInsertStringLiteral(this->tree_,s,size);
  }
  (tk->field_10).character_ = pCVar3;
  return;
}

Assistant:

void Lexer::lexUntilQuote(SyntaxToken* tk, unsigned char quote, unsigned int accLeng)
{
    const char* yytext = yytext_ - 1;
    yytext -= accLeng;

    while (yychar_
               && yychar_ != quote
               && yychar_ != '\n') {
        if (yychar_ == '\\')
            lexBackslash(tk->syntaxK_);
        else
            yyinput();
    }

    int yyleng = yytext_ - yytext + 1;
    yyleng += accLeng;

    if (yychar_ == quote)
        yyinput();

    if (quote == '\'')
        tk->character_ = tree_->findOrInsertCharacterConstant(yytext, yyleng);
    else
        tk->string_ = tree_->findOrInsertStringLiteral(yytext, yyleng);
}